

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int minimalSwapAndFlipIVar_superFast_all_noEBFC
              (word *pInOut,int nVars,int nWords,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  int local_204c;
  undefined1 local_2048 [4];
  int bitInfoTemp;
  word pDuplicate [1024];
  int local_3c;
  int i;
  uint *pCanonPhase_local;
  char *pCanonPerm_local;
  int *pStore_local;
  int nWords_local;
  int nVars_local;
  word *pInOut_local;
  
  local_204c = *pStore;
  memcpy(local_2048,pInOut,(long)nWords << 3);
  for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
    if (local_204c == pStore[local_3c + 1]) {
      minimalSwapAndFlipIVar_superFast_lessThen5_noEBFC
                (pInOut,local_3c,nWords,pCanonPerm,pCanonPhase);
    }
    else {
      local_204c = pStore[local_3c + 1];
    }
  }
  if (local_204c == pStore[local_3c + 1]) {
    minimalSwapAndFlipIVar_superFast_iVar5_noEBFC((uint *)pInOut,nWords,pCanonPerm,pCanonPhase);
  }
  else {
    local_204c = pStore[local_3c + 1];
  }
  for (local_3c = 6; local_3c < nVars + -1; local_3c = local_3c + 1) {
    if (local_204c == pStore[local_3c + 1]) {
      minimalSwapAndFlipIVar_superFast_moreThen5_noEBFC
                (pInOut,local_3c,nWords,pCanonPerm,pCanonPhase);
    }
    else {
      local_204c = pStore[local_3c + 1];
    }
  }
  iVar1 = memcmp(pInOut,local_2048,(long)nWords << 3);
  pInOut_local._4_4_ = (uint)(iVar1 != 0);
  return pInOut_local._4_4_;
}

Assistant:

int minimalSwapAndFlipIVar_superFast_all_noEBFC(word* pInOut, int nVars, int nWords, int * pStore, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i;
    word pDuplicate[1024];  
    int bitInfoTemp = pStore[0];
    memcpy(pDuplicate,pInOut,nWords*sizeof(word));
    for(i=0;i<5;i++)
    {
        if(bitInfoTemp == pStore[i+1])
            minimalSwapAndFlipIVar_superFast_lessThen5_noEBFC(pInOut, i, nWords, pCanonPerm, pCanonPhase);
        else
        {
            bitInfoTemp = pStore[i+1];
            continue;
        }
    }
    if(bitInfoTemp == pStore[i+1])
        minimalSwapAndFlipIVar_superFast_iVar5_noEBFC((unsigned*) pInOut, nWords, pCanonPerm, pCanonPhase);
    else    
        bitInfoTemp = pStore[i+1];
    
    for(i=6;i<nVars-1;i++)
    {
        if(bitInfoTemp == pStore[i+1])
            minimalSwapAndFlipIVar_superFast_moreThen5_noEBFC(pInOut, i, nWords, pCanonPerm, pCanonPhase);
        else
        {
            bitInfoTemp = pStore[i+1];
            continue;
        }
    }
    if(memcmp(pInOut,pDuplicate , nWords*sizeof(word)) == 0)
        return 0;
    else
        return 1;
}